

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O2

string * __thiscall
leveldb::Reverse_abi_cxx11_(string *__return_storage_ptr__,leveldb *this,Slice *key)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __tmp;
  pointer pcVar1;
  string str;
  allocator local_31;
  string local_30;
  
  Slice::ToString_abi_cxx11_(&local_30,(Slice *)this);
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_31);
  for (pcVar1 = local_30._M_dataplus._M_p + local_30._M_string_length;
      pcVar1 != local_30._M_dataplus._M_p; pcVar1 = pcVar1 + -1) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

static std::string Reverse(const Slice& key) {
  std::string str(key.ToString());
  std::string rev("");
  for (std::string::reverse_iterator rit = str.rbegin(); rit != str.rend();
       ++rit) {
    rev.push_back(*rit);
  }
  return rev;
}